

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  _Any_data *p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  socket_t sVar5;
  Error EVar6;
  const_iterator cVar7;
  long lVar8;
  string **ppsVar9;
  undefined8 *puVar10;
  byte bVar11;
  anon_class_72_9_423fa509 in_stack_fffffffffffffe80;
  string *local_138;
  int *local_130;
  Error *local_128;
  time_t *local_120;
  time_t *local_118;
  time_t *local_110;
  time_t *local_108;
  time_t *local_100;
  time_t *local_f8;
  _Any_data local_f0;
  code *local_e0;
  undefined8 uStack_d8;
  _Any_data local_d0;
  code *local_c0;
  undefined8 uStack_b8;
  Error *local_b0;
  time_t local_a8;
  time_t local_a0;
  time_t local_98;
  time_t local_90;
  time_t local_88;
  time_t local_80;
  undefined1 local_78 [8];
  string ip;
  code *local_48;
  int local_34;
  
  bVar11 = 0;
  if (((this->proxy_host_)._M_string_length == 0) || (iVar3 = this->proxy_port_, iVar3 == -1)) {
    local_78 = (undefined1  [8])&ip._M_string_length;
    ip._M_dataplus._M_p = (pointer)0x0;
    ip._M_string_length._0_1_ = 0;
    local_b0 = error;
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->addr_map_)._M_t,&this->host_);
    if ((_Rb_tree_header *)cVar7._M_node != &(this->addr_map_)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)local_78);
    }
    iVar3 = this->port_;
    iVar4 = this->address_family_;
    bVar2 = this->tcp_nodelay_;
    std::function<void_(int)>::function((function<void_(int)> *)&local_d0,&this->socket_options_);
    local_34 = iVar4;
    local_a8 = this->connection_timeout_sec_;
    local_a0 = this->connection_timeout_usec_;
    local_98 = this->read_timeout_sec_;
    local_90 = this->read_timeout_usec_;
    local_88 = this->write_timeout_sec_;
    local_80 = this->write_timeout_usec_;
    ip.field_2._8_8_ = 0;
    local_48 = (code *)0x0;
    if (local_c0 != (code *)0x0) {
      ip.field_2._8_8_ = local_d0._M_unused._M_object;
      local_48 = local_c0;
      local_c0 = (code *)0x0;
      uStack_b8 = 0;
    }
    local_138 = &this->interface_;
    local_130 = &local_34;
    local_128 = local_b0;
    local_120 = &local_a8;
    local_118 = &local_a0;
    local_110 = &local_98;
    local_108 = &local_90;
    local_100 = &local_88;
    local_f8 = &local_80;
    ppsVar9 = &local_138;
    puVar10 = (undefined8 *)&stack0xfffffffffffffe80;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar10 = *ppsVar9;
      ppsVar9 = ppsVar9 + (ulong)bVar11 * -2 + 1;
      puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
    }
    sVar5 = detail::
            create_socket<httplib::detail::create_client_socket(std::__cxx11::string_const&,std::__cxx11::string_const&,int,int,bool,std::function<void(int)>,long,long,long,long,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                      (&this->host_,(string *)local_78,iVar3,iVar4,0,bVar2,
                       (SocketOptions *)((long)&ip.field_2 + 8),in_stack_fffffffffffffe80);
    if (local_48 != (code *)0x0) {
      p_Var1 = (_Any_data *)((long)&ip.field_2 + 8);
      (*local_48)(p_Var1,p_Var1,__destroy_functor);
    }
    EVar6 = Success;
    if (sVar5 == -1) {
      if (*local_b0 == Success) {
        EVar6 = Connection;
        goto LAB_001b92bb;
      }
    }
    else {
LAB_001b92bb:
      *local_b0 = EVar6;
    }
    if (local_c0 != (code *)0x0) {
      (*local_c0)((_Any_data *)&local_d0,(_Any_data *)&local_d0,__destroy_functor);
    }
    goto LAB_001b9305;
  }
  local_78 = (undefined1  [8])&ip._M_string_length;
  ip._M_dataplus._M_p = (pointer)0x0;
  ip._M_string_length._0_1_ = 0;
  iVar4 = this->address_family_;
  bVar2 = this->tcp_nodelay_;
  std::function<void_(int)>::function((function<void_(int)> *)&local_f0,&this->socket_options_);
  local_34 = iVar4;
  local_a8 = this->connection_timeout_sec_;
  local_a0 = this->connection_timeout_usec_;
  local_98 = this->read_timeout_sec_;
  local_90 = this->read_timeout_usec_;
  local_88 = this->write_timeout_sec_;
  local_80 = this->write_timeout_usec_;
  ip.field_2._8_8_ = 0;
  local_48 = (code *)0x0;
  if (local_e0 != (code *)0x0) {
    ip.field_2._8_8_ = local_f0._M_unused._M_object;
    local_48 = local_e0;
    local_e0 = (code *)0x0;
    uStack_d8 = 0;
  }
  local_138 = &this->interface_;
  local_130 = &local_34;
  local_128 = error;
  local_120 = &local_a8;
  local_118 = &local_a0;
  local_110 = &local_98;
  local_108 = &local_90;
  local_100 = &local_88;
  local_f8 = &local_80;
  ppsVar9 = &local_138;
  puVar10 = (undefined8 *)&stack0xfffffffffffffe80;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *ppsVar9;
    ppsVar9 = ppsVar9 + (ulong)bVar11 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
  }
  sVar5 = detail::
          create_socket<httplib::detail::create_client_socket(std::__cxx11::string_const&,std::__cxx11::string_const&,int,int,bool,std::function<void(int)>,long,long,long,long,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                    (&this->proxy_host_,(string *)local_78,iVar3,iVar4,0,bVar2,
                     (SocketOptions *)((long)&ip.field_2 + 8),in_stack_fffffffffffffe80);
  if (local_48 != (code *)0x0) {
    p_Var1 = (_Any_data *)((long)&ip.field_2 + 8);
    (*local_48)(p_Var1,p_Var1,__destroy_functor);
  }
  EVar6 = Success;
  if (sVar5 == -1) {
    if (*error == Success) {
      EVar6 = Connection;
      goto LAB_001b9101;
    }
  }
  else {
LAB_001b9101:
    *error = EVar6;
  }
  if (local_e0 != (code *)0x0) {
    (*local_e0)((_Any_data *)&local_f0,(_Any_data *)&local_f0,__destroy_functor);
  }
LAB_001b9305:
  if (local_78 != (undefined1  [8])&ip._M_string_length) {
    operator_delete((void *)local_78,
                    CONCAT71(ip._M_string_length._1_7_,(undefined1)ip._M_string_length) + 1);
  }
  return sVar5;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error& error) const {
        if (!proxy_host_.empty() && proxy_port_ != -1) {
            return detail::create_client_socket(
                proxy_host_, std::string(), proxy_port_, address_family_, tcp_nodelay_,
                socket_options_, connection_timeout_sec_, connection_timeout_usec_,
                read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
                write_timeout_usec_, interface_, error);
        }

        // Check is custom IP specified for host_
        std::string ip;
        auto it = addr_map_.find(host_);
        if (it != addr_map_.end()) ip = it->second;

        return detail::create_client_socket(
            host_, ip, port_, address_family_, tcp_nodelay_, socket_options_,
            connection_timeout_sec_, connection_timeout_usec_, read_timeout_sec_,
            read_timeout_usec_, write_timeout_sec_, write_timeout_usec_, interface_,
            error);
    }